

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcsutil.c
# Opt level: O1

int ffwldp(double xpix,double ypix,double xref,double yref,double xrefpix,double yrefpix,double xinc
          ,double yinc,double rot,char *type,double *xpos,double *ypos,int *status)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double __x;
  double local_f8;
  double local_e8;
  double local_c8;
  
  if (0 < *status) {
    return *status;
  }
  dVar4 = (xpix - xrefpix) * xinc;
  local_c8 = (ypix - yrefpix) * yinc;
  dVar5 = cos(rot * 0.01745329252);
  dVar6 = sin(rot * 0.01745329252);
  if ((rot != 0.0) || (local_e8 = dVar4, NAN(rot))) {
    local_e8 = dVar4 * dVar5 - dVar6 * local_c8;
    local_c8 = local_c8 * dVar5 + dVar4 * dVar6;
  }
  dVar4 = yref * 0.01745329252;
  dVar7 = cos(dVar4);
  dVar8 = sin(dVar4);
  if (*type != '-') goto switchD_002028bc_caseD_4f;
  __x = xref * 0.01745329252;
  local_e8 = local_e8 * 0.01745329252;
  local_c8 = local_c8 * 0.01745329252;
  dVar9 = local_c8 * local_c8 + local_e8 * local_e8;
  bVar1 = type[1];
  if (0x4c < bVar1) {
    switch(bVar1) {
    case 0x4d:
      if ((type[2] != 'E') || (type[3] != 'R')) break;
      dVar5 = yinc * dVar5 + dVar6 * xinc;
      uVar3 = -(ulong)(dVar5 == 0.0);
      dVar5 = (double)(uVar3 & 0x3ff0000000000000 | ~uVar3 & (ulong)dVar5);
      dVar6 = (yref * 0.5 + 45.0) * 0.01745329252;
      dVar7 = tan(dVar6);
      dVar7 = log(dVar7);
      dVar6 = tan(dVar5 * 0.5 * 0.01745329252 + dVar6);
      dVar6 = log(dVar6);
      dVar4 = cos(dVar4);
      dVar16 = local_e8 /
               (double)(~-(ulong)(0.0 < dVar4) & 0x3ff0000000000000 |
                       (ulong)dVar4 & -(ulong)(0.0 < dVar4)) + __x;
      if (6.28318530717959 < ABS(dVar16 - __x)) goto LAB_0020376f;
      dVar4 = (dVar5 * 0.01745329252) / (dVar6 - dVar7);
      dVar4 = exp((double)(-(ulong)(dVar4 != 0.0) & (ulong)((local_c8 + dVar7 * dVar4) / dVar4)));
      dVar4 = atan(dVar4);
      local_f8 = dVar4 + dVar4 + -1.5707963267948974;
      goto LAB_0020360c;
    case 0x4e:
      if ((type[2] == 'C') && (type[3] == 'P')) {
        dVar7 = dVar7 - local_c8 * dVar8;
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
          dVar16 = atan2(local_e8,dVar7);
          dVar16 = dVar16 + __x;
          dVar5 = cos(dVar16 - __x);
          if (((dVar5 != 0.0) || (NAN(dVar5))) && (ABS(dVar7 / dVar5) <= 1.0)) {
            local_f8 = acos(dVar7 / dVar5);
            if (dVar4 < 0.0) {
              local_f8 = -local_f8;
            }
            goto LAB_0020360c;
          }
        }
        goto LAB_0020376f;
      }
      break;
    case 0x53:
      if (type[2] != 'T') {
        if ((type[2] != 'I') || (type[3] != 'N')) break;
        if (1.0 < dVar9) goto LAB_0020376f;
        dVar9 = 1.0 - dVar9;
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        dVar4 = dVar8 * dVar9 + local_c8 * dVar7;
        if (1.0 < ABS(dVar4)) goto LAB_0020376f;
        local_f8 = asin(dVar4);
        dVar4 = dVar7 * dVar9 - local_c8 * dVar8;
joined_r0x002035b7:
        if ((((dVar4 == 0.0) && (!NAN(dVar4))) && (local_e8 == 0.0)) && (!NAN(local_e8))) {
LAB_0020376f:
          *status = 0x1f5;
          return 0x1f5;
        }
        dVar16 = atan2(local_e8,dVar4);
        dVar16 = dVar16 + __x;
        goto LAB_0020360c;
      }
      if (type[3] != 'G') break;
      dVar4 = (4.0 - dVar9) / (dVar9 + 4.0);
      if (1.0 < ABS(dVar4)) goto LAB_0020376f;
      dVar5 = dVar4 * dVar8 + local_c8 * dVar7 * (dVar4 + 1.0) * 0.5;
      if (1.0 < ABS(dVar5)) goto LAB_0020376f;
      local_f8 = asin(dVar5);
      dVar5 = cos(local_f8);
      if ((ABS(dVar5) < 1e-05) ||
         (dVar4 = (local_e8 * (dVar4 + 1.0)) / (dVar5 + dVar5), 1.0 < ABS(dVar4)))
      goto LAB_0020376f;
      dVar4 = asin(dVar4);
      dVar5 = sin(local_f8);
      dVar6 = cos(local_f8);
      dVar9 = cos(dVar4);
      dVar5 = dVar9 * dVar6 * dVar7 + dVar5 * dVar8 + 1.0;
      if (ABS(dVar5) < 1e-05) goto LAB_0020376f;
      dVar6 = sin(local_f8);
      dVar9 = cos(local_f8);
      dVar16 = cos(dVar4);
      dVar6 = dVar6 * dVar7 - dVar8 * dVar9 * dVar16;
      uVar3 = -(ulong)(1e-05 < ABS((dVar6 + dVar6) / dVar5 - local_c8));
      local_e8 = (double)(~uVar3 & (ulong)dVar4 | (ulong)(3.141592653589795 - dVar4) & uVar3);
      goto LAB_00202b0e;
    case 0x54:
      if ((type[2] == 'A') && (type[3] == 'N')) {
        dVar4 = cos(__x);
        dVar5 = sin(__x);
        dVar6 = cos(__x);
        dVar9 = (dVar4 * dVar7 - dVar5 * local_e8) - dVar6 * local_c8 * dVar8;
        dVar4 = sin(__x);
        dVar5 = cos(__x);
        dVar6 = sin(__x);
        dVar4 = (dVar4 * dVar7 + dVar5 * local_e8) - dVar6 * local_c8 * dVar8;
        dVar16 = atan2(dVar4,dVar9);
        dVar4 = dVar9 * dVar9 + dVar4 * dVar4;
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        local_f8 = atan((local_c8 * dVar7 + dVar8) / dVar4);
        goto LAB_0020360c;
      }
    }
switchD_002028bc_caseD_4f:
    *status = 0x1f8;
    return 0x1f8;
  }
  dVar16 = __x;
  if (bVar1 == 0x41) {
    if (type[2] != 'I') {
      if ((type[2] != 'R') || (type[3] != 'C')) goto switchD_002028bc_caseD_4f;
      if (9.869604401089369 <= dVar9) goto LAB_0020376f;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar4 = cos(dVar9);
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        dVar5 = sin(dVar9);
        dVar5 = dVar5 / dVar9;
      }
      else {
        dVar5 = 1.0;
      }
      dVar6 = local_c8 * dVar7 * dVar5 + dVar8 * dVar4;
      if (1.0 < ABS(dVar6)) goto LAB_0020376f;
      local_f8 = asin(dVar6);
      dVar4 = dVar4 - dVar8 * dVar6;
      local_e8 = dVar7 * local_e8 * dVar5;
      goto joined_r0x002035b7;
    }
    if (type[3] != 'T') goto switchD_002028bc_caseD_4f;
    dVar7 = yinc * dVar5 + dVar6 * xinc;
    uVar3 = -(ulong)(dVar7 == 0.0);
    dVar7 = (double)(uVar3 & 0x3f91df46a252dd11 | ~uVar3 & (ulong)(dVar7 * 0.01745329252));
    dVar8 = dVar4 + dVar7;
    dVar9 = sin(dVar8);
    dVar8 = cos(dVar8);
    dVar8 = (dVar8 + 1.0) * 0.5;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    dVar10 = sin(dVar4);
    dVar11 = cos(dVar4);
    dVar11 = (dVar11 + 1.0) * 0.5;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    dVar5 = xinc * dVar5 - dVar6 * yinc;
    uVar3 = -(ulong)(dVar5 == 0.0);
    dVar5 = (double)(uVar3 & 0x3f91df46a252dd11 | ~uVar3 & (ulong)(dVar5 * 0.01745329252));
    dVar6 = cos(dVar4);
    dVar12 = dVar5 * 0.5;
    dVar13 = sin(dVar12);
    dVar14 = cos(dVar4);
    dVar12 = cos(dVar12);
    dVar12 = (dVar12 * dVar14 + 1.0) * 0.5;
    if (dVar12 < 0.0) {
      dVar12 = sqrt(dVar12);
    }
    else {
      dVar12 = SQRT(dVar12);
    }
    dVar14 = sin(dVar4);
    dVar15 = cos(dVar4);
    dVar15 = (dVar15 + 1.0) * 0.5;
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      dVar15 = SQRT(dVar15);
    }
    if ((((local_e8 == 0.0) && (!NAN(local_e8))) && (local_c8 == 0.0)) &&
       (local_f8 = dVar4, !NAN(local_c8))) goto LAB_0020360c;
    dVar13 = (dVar6 + dVar6) * dVar13;
    dVar4 = dVar9 / dVar8 - dVar10 / dVar11;
    uVar3 = -(ulong)(dVar13 == 0.0);
    uVar2 = -(ulong)(dVar4 == 0.0);
    dVar7 = dVar7 / (double)(uVar2 & 0x3ff0000000000000 | ~uVar2 & (ulong)dVar4);
    dVar5 = (dVar5 * dVar12) / (double)(uVar3 & 0x3ff0000000000000 | ~uVar3 & (ulong)dVar13);
    local_c8 = local_c8 + (dVar14 * dVar7) / dVar15;
    dVar4 = local_c8 / dVar7;
    dVar4 = (4.0 - (local_e8 * local_e8) / (dVar5 * 4.0 * dVar5)) - dVar4 * dVar4;
    if ((4.0 < dVar4) || (dVar4 < 2.0)) goto LAB_0020376f;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar7 = (local_c8 * dVar4 * 0.5) / dVar7;
    if (1.0 < ABS(dVar7)) goto LAB_0020376f;
    local_f8 = asin(dVar7);
    dVar6 = cos(local_f8);
    if (ABS(dVar6) < 1e-05) goto LAB_0020376f;
    dVar6 = cos(local_f8);
    dVar4 = (local_e8 * dVar4 * 0.5) / (dVar6 * (dVar5 + dVar5));
    if (1.0 < ABS(dVar4)) goto LAB_0020376f;
    local_e8 = asin(dVar4);
    local_e8 = local_e8 + local_e8;
  }
  else {
    if (bVar1 == 0x43) {
      if ((type[2] == 'A') && (type[3] == 'R')) {
        local_f8 = dVar4 + local_c8;
        dVar16 = local_e8 + __x;
        goto LAB_0020360c;
      }
      goto switchD_002028bc_caseD_4f;
    }
    if (((bVar1 != 0x47) || (type[2] != 'L')) || (type[3] != 'S')) goto switchD_002028bc_caseD_4f;
    local_f8 = dVar4 + local_c8;
    if ((1.5707963267948974 < ABS(local_f8)) ||
       (dVar4 = cos(local_f8), dVar4 * 6.28318530717959 * 0.5 < ABS(local_e8))) goto LAB_0020376f;
    if (dVar4 <= 1e-05) goto LAB_0020360c;
    local_e8 = local_e8 / dVar4;
  }
LAB_00202b0e:
  dVar16 = local_e8 + __x;
LAB_0020360c:
  uVar3 = -(ulong)(3.141592653589795 < dVar16 - __x);
  dVar4 = (double)(~uVar3 & (ulong)dVar16 | (ulong)(dVar16 + -6.28318530717959) & uVar3);
  uVar3 = -(ulong)(dVar4 - __x < -3.141592653589795);
  dVar4 = (double)(~uVar3 & (ulong)dVar4 | (ulong)(dVar4 + 6.28318530717959) & uVar3);
  *xpos = (double)(~-(ulong)(dVar4 < 0.0) & (ulong)dVar4 |
                  (ulong)(dVar4 + 6.28318530717959) & -(ulong)(dVar4 < 0.0)) / 0.01745329252;
  *ypos = local_f8 / 0.01745329252;
  return *status;
}

Assistant:

int ffwldp(double xpix, double ypix, double xref, double yref,
      double xrefpix, double yrefpix, double xinc, double yinc, double rot,
      char *type, double *xpos, double *ypos, int *status)

/* This routine is based on the classic AIPS WCS routine. 

   It converts from pixel location to RA,Dec for 9 projective geometries:
   "-CAR", "-SIN", "-TAN", "-ARC", "-NCP", "-GLS", "-MER", "-AIT" and "-STG".
*/

/*-----------------------------------------------------------------------*/
/* routine to determine accurate position for pixel coordinates          */
/* returns 0 if successful otherwise:                                    */
/* 501 = angle too large for projection;                                 */
/* does: -CAR, -SIN, -TAN, -ARC, -NCP, -GLS, -MER, -AIT  -STG projections*/
/* Input:                                                                */
/*   f   xpix    x pixel number  (RA or long without rotation)           */
/*   f   ypiy    y pixel number  (dec or lat without rotation)           */
/*   d   xref    x reference coordinate value (deg)                      */
/*   d   yref    y reference coordinate value (deg)                      */
/*   f   xrefpix x reference pixel                                       */
/*   f   yrefpix y reference pixel                                       */
/*   f   xinc    x coordinate increment (deg)                            */
/*   f   yinc    y coordinate increment (deg)                            */
/*   f   rot     rotation (deg)  (from N through E)                      */
/*   c  *type    projection type code e.g. "-SIN";                       */
/* Output:                                                               */
/*   d   *xpos   x (RA) coordinate (deg)                                 */
/*   d   *ypos   y (dec) coordinate (deg)                                */
/*-----------------------------------------------------------------------*/
 {double cosr, sinr, dx, dy, dz, temp, x, y, z;
  double sins, coss, dect, rat, dt, l, m, mg, da, dd, cos0, sin0;
  double dec0, ra0;
  double geo1, geo2, geo3;
  double deps = 1.0e-5;
  char *cptr;
  
  if (*status > 0)
     return(*status);

/*   Offset from ref pixel  */
  dx = (xpix-xrefpix) * xinc;
  dy = (ypix-yrefpix) * yinc;

/*   Take out rotation  */
  cosr = cos(rot * D2R);
  sinr = sin(rot * D2R);
  if (rot != 0.0) {
     temp = dx * cosr - dy * sinr;
     dy = dy * cosr + dx * sinr;
     dx = temp;
  }

/* convert to radians  */
  ra0 = xref * D2R;
  dec0 = yref * D2R;

  l = dx * D2R;
  m = dy * D2R;
  sins = l*l + m*m;
  cos0 = cos(dec0);
  sin0 = sin(dec0);

  if (*type != '-') {  /* unrecognized projection code */
     return(*status = 504);
  }

    cptr = type + 1;

    if (*cptr == 'C') { /* linear -CAR */
      if (*(cptr + 1) != 'A' ||  *(cptr + 2) != 'R') {
         return(*status = 504);
      }
      rat =  ra0 + l;
      dect = dec0 + m;

    } else if (*cptr == 'T') {  /* -TAN */
      if (*(cptr + 1) != 'A' ||  *(cptr + 2) != 'N') {
         return(*status = 504);
      }
      x = cos0*cos(ra0) - l*sin(ra0) - m*cos(ra0)*sin0;
      y = cos0*sin(ra0) + l*cos(ra0) - m*sin(ra0)*sin0;
      z = sin0                       + m*         cos0;
      rat  = atan2( y, x );
      dect = atan ( z / sqrt(x*x+y*y) );

    } else if (*cptr == 'S') {

      if (*(cptr + 1) == 'I' &&  *(cptr + 2) == 'N') { /* -SIN */
          if (sins>1.0)
	    return(*status = 501);
          coss = sqrt (1.0 - sins);
          dt = sin0 * coss + cos0 * m;
          if ((dt>1.0) || (dt<-1.0))
	    return(*status = 501);
          dect = asin (dt);
          rat = cos0 * coss - sin0 * m;
          if ((rat==0.0) && (l==0.0))
	    return(*status = 501);
          rat = atan2 (l, rat) + ra0;

       } else if (*(cptr + 1) == 'T' &&  *(cptr + 2) == 'G') {  /* -STG Sterographic*/
          dz = (4.0 - sins) / (4.0 + sins);
          if (fabs(dz)>1.0)
	    return(*status = 501);
          dect = dz * sin0 + m * cos0 * (1.0+dz) / 2.0;
          if (fabs(dect)>1.0)
	    return(*status = 501);
          dect = asin (dect);
          rat = cos(dect);
          if (fabs(rat)<deps)
	    return(*status = 501);
          rat = l * (1.0+dz) / (2.0 * rat);
          if (fabs(rat)>1.0)
	    return(*status = 501);
          rat = asin (rat);
          mg = 1.0 + sin(dect) * sin0 + cos(dect) * cos0 * cos(rat);
          if (fabs(mg)<deps)
	    return(*status = 501);
          mg = 2.0 * (sin(dect) * cos0 - cos(dect) * sin0 * cos(rat)) / mg;
          if (fabs(mg-m)>deps)
	    rat = TWOPI /2.0 - rat;
          rat = ra0 + rat;
        } else  {
          return(*status = 504);
        }
 
    } else if (*cptr == 'A') {

      if (*(cptr + 1) == 'R' &&  *(cptr + 2) == 'C') { /* ARC */
          if (sins>=TWOPI*TWOPI/4.0)
	    return(*status = 501);
          sins = sqrt(sins);
          coss = cos (sins);
          if (sins!=0.0)
	    sins = sin (sins) / sins;
          else
	    sins = 1.0;
          dt = m * cos0 * sins + sin0 * coss;
          if ((dt>1.0) || (dt<-1.0))
	    return(*status = 501);
          dect = asin (dt);
          da = coss - dt * sin0;
          dt = l * sins * cos0;
          if ((da==0.0) && (dt==0.0))
	    return(*status = 501);
          rat = ra0 + atan2 (dt, da);

      } else if (*(cptr + 1) == 'I' &&  *(cptr + 2) == 'T') {  /* -AIT Aitoff */
          dt = yinc*cosr + xinc*sinr;
          if (dt==0.0)
	    dt = 1.0;
          dt = dt * D2R;
          dy = yref * D2R;
          dx = sin(dy+dt)/sqrt((1.0+cos(dy+dt))/2.0) -
	      sin(dy)/sqrt((1.0+cos(dy))/2.0);
          if (dx==0.0)
	    dx = 1.0;
          geo2 = dt / dx;
          dt = xinc*cosr - yinc* sinr;
          if (dt==0.0)
	    dt = 1.0;
          dt = dt * D2R;
          dx = 2.0 * cos(dy) * sin(dt/2.0);
          if (dx==0.0) dx = 1.0;
          geo1 = dt * sqrt((1.0+cos(dy)*cos(dt/2.0))/2.0) / dx;
          geo3 = geo2 * sin(dy) / sqrt((1.0+cos(dy))/2.0);
          rat = ra0;
          dect = dec0;
          if ((l != 0.0) || (m != 0.0)) {
            dz = 4.0 - l*l/(4.0*geo1*geo1) - ((m+geo3)/geo2)*((m+geo3)/geo2) ;
            if ((dz>4.0) || (dz<2.0)) return(*status = 501);
            dz = 0.5 * sqrt (dz);
            dd = (m+geo3) * dz / geo2;
            if (fabs(dd)>1.0) return(*status = 501);
            dd = asin (dd);
            if (fabs(cos(dd))<deps) return(*status = 501);
            da = l * dz / (2.0 * geo1 * cos(dd));
            if (fabs(da)>1.0) return(*status = 501);
            da = asin (da);
            rat = ra0 + 2.0 * da;
            dect = dd;
          }
        } else  {
          return(*status = 504);
        }
 
    } else if (*cptr == 'N') { /* -NCP North celestial pole*/
      if (*(cptr + 1) != 'C' ||  *(cptr + 2) != 'P') {
         return(*status = 504);
      }
      dect = cos0 - m * sin0;
      if (dect==0.0)
        return(*status = 501);
      rat = ra0 + atan2 (l, dect);
      dt = cos (rat-ra0);
      if (dt==0.0)
        return(*status = 501);
      dect = dect / dt;
      if ((dect>1.0) || (dect<-1.0))
        return(*status = 501);
      dect = acos (dect);
      if (dec0<0.0) dect = -dect;

    } else if (*cptr == 'G') {   /* -GLS global sinusoid */
      if (*(cptr + 1) != 'L' ||  *(cptr + 2) != 'S') {
         return(*status = 504);
      }
      dect = dec0 + m;
      if (fabs(dect)>TWOPI/4.0)
        return(*status = 501);
      coss = cos (dect);
      if (fabs(l)>TWOPI*coss/2.0)
        return(*status = 501);
      rat = ra0;
      if (coss>deps) rat = rat + l / coss;

    } else if (*cptr == 'M') {  /* -MER mercator*/
      if (*(cptr + 1) != 'E' ||  *(cptr + 2) != 'R') {
         return(*status = 504);
      }
      dt = yinc * cosr + xinc * sinr;
      if (dt==0.0) dt = 1.0;
      dy = (yref/2.0 + 45.0) * D2R;
      dx = dy + dt / 2.0 * D2R;
      dy = log (tan (dy));
      dx = log (tan (dx));
      geo2 = dt * D2R / (dx - dy);
      geo3 = geo2 * dy;
      geo1 = cos (yref*D2R);
      if (geo1<=0.0) geo1 = 1.0;
      rat = l / geo1 + ra0;
      if (fabs(rat - ra0) > TWOPI)
        return(*status = 501);
      dt = 0.0;
      if (geo2!=0.0) dt = (m + geo3) / geo2;
      dt = exp (dt);
      dect = 2.0 * atan (dt) - TWOPI / 4.0;

    } else  {
      return(*status = 504);
    }

  /*  correct for RA rollover  */
  if (rat-ra0>TWOPI/2.0) rat = rat - TWOPI;
  if (rat-ra0<-TWOPI/2.0) rat = rat + TWOPI;
  if (rat < 0.0) rat += TWOPI;

  /*  convert to degrees  */
  *xpos  = rat  / D2R;
  *ypos  = dect  / D2R;
  return(*status);
}